

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

Bool WantIndent(TidyDocImpl *doc)

{
  ulong uVar1;
  uint uVar2;
  Bool BVar3;
  TidyPrintImpl *pprint_00;
  byte local_21;
  Bool local_1c;
  Bool indentAttrs;
  Bool wantIt;
  TidyPrintImpl *pprint;
  TidyDocImpl *doc_local;
  
  pprint_00 = &doc->pprint;
  uVar2 = GetSpaces(pprint_00);
  local_1c = (Bool)(uVar2 != 0);
  if (local_1c != no) {
    uVar1 = (doc->config).value[0x23].v;
    BVar3 = IsWrapInAttrVal(pprint_00);
    if ((BVar3 == no) || (local_21 = 0, (int)uVar1 != 0)) {
      BVar3 = IsWrapInString(pprint_00);
      local_21 = BVar3 != no ^ 0xff;
    }
    local_1c = (Bool)(local_21 & 1);
  }
  return local_1c;
}

Assistant:

static Bool WantIndent( TidyDocImpl* doc )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool wantIt = GetSpaces(pprint) > 0;
    if ( wantIt )
    {
        Bool indentAttrs = cfgBool( doc, TidyIndentAttributes );
        wantIt = ( ( !IsWrapInAttrVal(pprint) || indentAttrs ) &&
                   !IsWrapInString(pprint) );
    }
    return wantIt;
}